

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O2

Index anurbs::Nurbs::
      upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                 *values,Index first,Index last,double value)

{
  ulong uVar1;
  ulong uVar2;
  CoeffReturnType CVar3;
  
  uVar1 = last - first;
  while (uVar2 = uVar1, 0 < (long)uVar2) {
    uVar1 = uVar2 >> 1;
    CVar3 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)values,first + uVar1);
    if (CVar3 <= value) {
      first = first + uVar1 + 1;
      uVar1 = ~uVar1 + uVar2;
    }
  }
  return first;
}

Assistant:

static Index upper_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (!(value < values[i])) {
                first = ++i;
                count -= step + 1;
            } else {
                count = step;
            }
        }
        return first;
    }